

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O1

int bip32_privkey_tweak_add(uchar *tweak,size_t tweak_len,ext_key *key_out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  if (tweak == (uchar *)0x0) {
    return -2;
  }
  if (*(char *)(tweak_len + 0xa0) == '\0') {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if (uVar6 == 0x1f) break;
      uVar4 = uVar6 + 1;
    } while (*(char *)(tweak_len + 0xa1 + uVar6) == '\0');
    if (0x1e < uVar6) {
      uVar1 = *(undefined8 *)tweak;
      uVar2 = *(undefined8 *)(tweak + 8);
      uVar3 = *(undefined8 *)(tweak + 0x18);
      *(undefined8 *)(tweak_len + 0xb0) = *(undefined8 *)(tweak + 0x10);
      *(undefined8 *)(tweak_len + 0xb8) = uVar3;
      *(undefined8 *)(tweak_len + 0xa0) = uVar1;
      *(undefined8 *)(tweak_len + 0xa8) = uVar2;
      return 0;
    }
  }
  iVar5 = privkey_tweak_add((uchar *)(tweak_len + 0xa0),tweak);
  return (uint)(iVar5 != 0) * 2 + -2;
}

Assistant:

static int bip32_privkey_tweak_add(const unsigned char *tweak, size_t tweak_len,
                                   struct ext_key *key_out)
{
    if (!tweak || tweak_len != sizeof(key_out->pub_key_tweak_sum) || !key_out)
        return WALLY_EINVAL;

    if (!mem_is_zero(key_out->pub_key_tweak_sum, tweak_len))
        return privkey_tweak_add(key_out->pub_key_tweak_sum, tweak) ? WALLY_OK : WALLY_EINVAL;

    /* tweak sum is zero: start with the tweak */
    memcpy(key_out->pub_key_tweak_sum, tweak, tweak_len);
    return WALLY_OK;
}